

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::VariableExpr::do_evaluate(VariableExpr *this,shared_ptr<minja::Context> *context)

{
  int iVar1;
  element_type *this_00;
  element_type *peVar2;
  Value *in_RSI;
  Value *in_RDI;
  Value *in_stack_fffffffffffffef0;
  Value *this_01;
  Value local_c8;
  undefined1 local_68 [104];
  
  this_00 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x3176e6);
  Value::Value((Value *)this_00,(string *)in_RSI);
  iVar1 = (*this_00->_vptr_Context[4])(this_00,local_68);
  Value::~Value(in_stack_fffffffffffffef0);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    peVar2 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x317782);
    this_01 = &local_c8;
    Value::Value((Value *)this_00,(string *)in_RSI);
    (*peVar2->_vptr_Context[3])(peVar2,this_01);
    Value::Value((Value *)this_00,in_RSI);
    Value::~Value(this_01);
  }
  else {
    Value::Value(in_stack_fffffffffffffef0);
  }
  return in_RDI;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!context->contains(name)) {
            return Value();
        }
        return context->at(name);
    }